

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char **ppcVar1;
  char *__s;
  pointer piVar2;
  size_t sVar3;
  size_t sVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  FILE *__stream;
  pointer pvVar9;
  int *piVar10;
  EVP_PKEY_CTX *ctx;
  size_t sVar11;
  ulong uVar12;
  size_t i;
  size_t j;
  allocator local_789;
  int *local_788;
  char *local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  ulong local_750;
  int nconsumed;
  pointer pvStack_740;
  pointer local_738;
  char *local_730;
  char **local_728;
  ulong local_720;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  QuantNet net;
  char filepath [256];
  Option opt;
  string method;
  
  if (4 < argc) {
    local_720 = (ulong)(uint)argc;
    uVar7 = 1;
    do {
      if (local_720 == uVar7) {
        pcVar8 = argv[1];
        ctx = (EVP_PKEY_CTX *)argv[2];
        __s = argv[3];
        local_730 = argv[4];
        local_728 = argv;
        ncnn::Option::Option(&opt);
        opt.num_threads = 1;
        opt.use_fp16_packed = false;
        opt.use_fp16_storage = false;
        opt.use_fp16_arithmetic = false;
        QuantNet::QuantNet(&net);
        net.super_Net.opt.num_threads = opt.num_threads;
        net.super_Net.opt.lightmode = opt.lightmode;
        net.super_Net.opt._1_3_ = opt._1_3_;
        net.super_Net.opt.use_fp16_packed = opt.use_fp16_packed;
        net.super_Net.opt.use_fp16_storage = opt.use_fp16_storage;
        net.super_Net.opt.use_bf16_storage = opt.use_bf16_storage;
        net.super_Net.opt.use_fp16_arithmetic = opt.use_fp16_arithmetic;
        net.super_Net.opt.use_int8_packed = opt.use_int8_packed;
        net.super_Net.opt.use_int8_storage = opt.use_int8_storage;
        net.super_Net.opt.use_int8_arithmetic = opt.use_int8_arithmetic;
        net.super_Net.opt.use_packing_layout = opt.use_packing_layout;
        net.super_Net.opt.flush_denormals = opt.flush_denormals;
        net.super_Net.opt.use_local_pool_allocator = opt.use_local_pool_allocator;
        net.super_Net.opt.use_reserved_1 = opt.use_reserved_1;
        net.super_Net.opt.use_reserved_2 = opt.use_reserved_2;
        net.super_Net.opt.use_reserved_3 = opt.use_reserved_3;
        net.super_Net.opt.use_reserved_4 = opt.use_reserved_4;
        net.super_Net.opt.use_reserved_5 = opt.use_reserved_5;
        net.super_Net.opt.use_reserved_6 = opt.use_reserved_6;
        net.super_Net.opt.use_reserved_7 = opt.use_reserved_7;
        net.super_Net.opt.use_reserved_8 = opt.use_reserved_8;
        net.super_Net.opt.use_reserved_9 = opt.use_reserved_9;
        net.super_Net.opt.use_reserved_10 = opt.use_reserved_10;
        net.super_Net.opt.use_reserved_11 = opt.use_reserved_11;
        net.super_Net.opt.use_shader_pack8 = opt.use_shader_pack8;
        net.super_Net.opt.use_subgroup_basic = opt.use_subgroup_basic;
        net.super_Net.opt.use_subgroup_vote = opt.use_subgroup_vote;
        net.super_Net.opt.use_subgroup_ballot = opt.use_subgroup_ballot;
        net.super_Net.opt.use_subgroup_shuffle = opt.use_subgroup_shuffle;
        net.super_Net.opt.use_image_storage = opt.use_image_storage;
        net.super_Net.opt.use_tensor_storage = opt.use_tensor_storage;
        net.super_Net.opt.use_weight_fp16_storage = opt.use_weight_fp16_storage;
        net.super_Net.opt.workspace_allocator = opt.workspace_allocator;
        net.super_Net.opt.openmp_blocktime = opt.openmp_blocktime;
        net.super_Net.opt.use_winograd_convolution = opt.use_winograd_convolution;
        net.super_Net.opt.use_sgemm_convolution = opt.use_sgemm_convolution;
        net.super_Net.opt.use_int8_inference = opt.use_int8_inference;
        net.super_Net.opt.use_vulkan_compute = opt.use_vulkan_compute;
        net.super_Net.opt.blob_allocator = opt.blob_allocator;
        ncnn::Net::load_param(&net.super_Net,pcVar8);
        ncnn::Net::load_model(&net.super_Net,(char *)ctx);
        QuantNet::init(&net,ctx);
        _nconsumed = (pointer)0x0;
        pvStack_740 = (pointer)0x0;
        local_738 = (pointer)0x0;
        pcVar8 = strtok(__s,",");
        goto LAB_00142022;
      }
      ppcVar1 = argv + uVar7;
      uVar7 = uVar7 + 1;
    } while (**ppcVar1 != '-');
  }
  show_usage();
  return -1;
LAB_00142022:
  if (pcVar8 == (char *)0x0) goto LAB_0014210a;
  __stream = fopen(pcVar8,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"fopen %s failed\n",pcVar8);
    goto LAB_0014210a;
  }
  paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while ((iVar6 = feof(__stream), iVar6 == 0 &&
         (pcVar8 = fgets((char *)&method,0x400,__stream), pcVar8 != (char *)0x0))) {
    iVar6 = __isoc99_sscanf(&method,"%255s",filepath);
    if (iVar6 == 1) {
      std::__cxx11::string::string((string *)&local_778,filepath,&local_789);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&paths,
                 &local_778);
      std::__cxx11::string::~string((string *)&local_778);
    }
  }
  fclose(__stream);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::push_back((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)&nconsumed,(value_type *)&paths);
  pcVar8 = strtok((char *)0x0,",");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&paths);
  goto LAB_00142022;
LAB_0014210a:
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::_M_move_assign(&net.listspaths,
                   (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)&nconsumed);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)&nconsumed);
  std::__cxx11::string::string((string *)&method,"kl",(allocator *)filepath);
  for (uVar7 = 5; uVar7 < local_720; uVar7 = uVar7 + 1) {
    piVar10 = (int *)local_728[uVar7];
    local_750 = uVar7;
    pcVar8 = strchr((char *)piVar10,0x3d);
    if (pcVar8 == (char *)0x0) {
      fprintf(_stderr,"unrecognized arg %s\n",piVar10);
      uVar7 = local_750;
    }
    else {
      *pcVar8 = '\0';
      pcVar8 = pcVar8 + 1;
      local_788 = piVar10;
      if (*piVar10 == 0x6e61656d) {
        parse_comma_float_array_list
                  ((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *)filepath,pcVar8);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::_M_move_assign(&net.means,(string *)filepath);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   *)filepath);
      }
      if (*local_788 == 0x6d726f6e) {
        parse_comma_float_array_list
                  ((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *)filepath,pcVar8);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::_M_move_assign(&net.norms,(string *)filepath);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   *)filepath);
      }
      piVar10 = local_788;
      local_780 = pcVar8;
      iVar6 = bcmp(local_788,"shape",5);
      if (iVar6 == 0) {
        local_778._M_dataplus._M_p = (pointer)0x0;
        local_778._M_string_length = 0;
        local_778.field_2._M_allocated_capacity = 0;
        pcVar8 = strtok(local_780,"[]");
        while (pcVar8 != (char *)0x0) {
          _nconsumed = (pointer)((ulong)_nconsumed & 0xffffffff00000000);
          iVar6 = __isoc99_sscanf(pcVar8,"%d%n",&paths,&nconsumed);
          if (iVar6 == 1) {
            iVar6 = nconsumed;
            filepath[0] = '\0';
            filepath[1] = '\0';
            filepath[2] = '\0';
            filepath[3] = '\0';
            filepath[4] = '\0';
            filepath[5] = '\0';
            filepath[6] = '\0';
            filepath[7] = '\0';
            filepath[8] = '\0';
            filepath[9] = '\0';
            filepath[10] = '\0';
            filepath[0xb] = '\0';
            filepath[0xc] = '\0';
            filepath[0xd] = '\0';
            filepath[0xe] = '\0';
            filepath[0xf] = '\0';
            filepath[0x10] = '\0';
            filepath[0x11] = '\0';
            filepath[0x12] = '\0';
            filepath[0x13] = '\0';
            filepath[0x14] = '\0';
            filepath[0x15] = '\0';
            filepath[0x16] = '\0';
            filepath[0x17] = '\0';
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)filepath,(value_type_conflict2 *)&paths)
            ;
            while( true ) {
              pcVar8 = pcVar8 + iVar6;
              iVar6 = __isoc99_sscanf(pcVar8,",%d%n",&paths,&nconsumed);
              if (iVar6 != 1) break;
              iVar6 = nconsumed;
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)filepath,
                         (value_type_conflict2 *)&paths);
            }
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)&local_778,(value_type *)filepath);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)filepath);
          }
          pcVar8 = strtok((char *)0x0,"[]");
        }
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::_M_move_assign(&net.shapes,&local_778);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)&local_778);
        piVar10 = local_788;
      }
      iVar6 = bcmp(piVar10,"pixel",5);
      if (iVar6 == 0) {
        filepath[0] = '\0';
        filepath[1] = '\0';
        filepath[2] = '\0';
        filepath[3] = '\0';
        filepath[4] = '\0';
        filepath[5] = '\0';
        filepath[6] = '\0';
        filepath[7] = '\0';
        filepath[8] = '\0';
        filepath[9] = '\0';
        filepath[10] = '\0';
        filepath[0xb] = '\0';
        filepath[0xc] = '\0';
        filepath[0xd] = '\0';
        filepath[0xe] = '\0';
        filepath[0xf] = '\0';
        filepath[0x10] = '\0';
        filepath[0x11] = '\0';
        filepath[0x12] = '\0';
        filepath[0x13] = '\0';
        filepath[0x14] = '\0';
        filepath[0x15] = '\0';
        filepath[0x16] = '\0';
        filepath[0x17] = '\0';
        pcVar8 = local_780;
        while (pcVar8 = strtok(pcVar8,","), pcVar8 != (char *)0x0) {
          iVar6 = strcmp(pcVar8,"RAW");
          if (iVar6 == 0) {
            local_778._M_dataplus._M_p._0_4_ = 0xffffff17;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      ((vector<int,_std::allocator<int>_> *)filepath,(int *)&local_778);
          }
          iVar6 = strcmp(pcVar8,"RGB");
          if (iVar6 == 0) {
            local_778._M_dataplus._M_p._0_4_ = 1;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      ((vector<int,_std::allocator<int>_> *)filepath,(int *)&local_778);
          }
          iVar6 = strcmp(pcVar8,"BGR");
          if (iVar6 == 0) {
            local_778._M_dataplus._M_p._0_4_ = 2;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      ((vector<int,_std::allocator<int>_> *)filepath,(int *)&local_778);
          }
          iVar6 = strcmp(pcVar8,"GRAY");
          if (iVar6 == 0) {
            local_778._M_dataplus._M_p._0_4_ = 3;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      ((vector<int,_std::allocator<int>_> *)filepath,(int *)&local_778);
          }
          iVar6 = strcmp(pcVar8,"RGBA");
          if (iVar6 == 0) {
            local_778._M_dataplus._M_p._0_4_ = 4;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      ((vector<int,_std::allocator<int>_> *)filepath,(int *)&local_778);
          }
          iVar6 = strcmp(pcVar8,"BGRA");
          if (iVar6 == 0) {
            local_778._M_dataplus._M_p._0_4_ = 5;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      ((vector<int,_std::allocator<int>_> *)filepath,(int *)&local_778);
          }
          pcVar8 = (char *)0x0;
        }
        std::vector<int,_std::allocator<int>_>::_M_move_assign
                  (&net.type_to_pixels,(string *)filepath);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)filepath);
        piVar10 = local_788;
      }
      iVar6 = bcmp(piVar10,"thread",6);
      if (iVar6 == 0) {
        net.quantize_num_threads = atoi(local_780);
      }
      iVar6 = bcmp(local_788,"method",6);
      uVar7 = local_750;
      if (iVar6 == 0) {
        std::__cxx11::string::string((string *)filepath,local_780,(allocator *)&local_778);
        std::__cxx11::string::operator=((string *)&method,(string *)filepath);
        std::__cxx11::string::~string((string *)filepath);
      }
    }
  }
  uVar12 = (long)net.input_blobs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)net.input_blobs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2;
  uVar7 = ((long)net.listspaths.
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)net.listspaths.
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  if (uVar7 == uVar12) {
    uVar7 = ((long)net.means.
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)net.means.
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x18;
    if (uVar7 != uVar12) {
      pcVar8 = "expect %d means, but got %d\n";
      goto LAB_0014260c;
    }
    uVar7 = ((long)net.norms.
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)net.norms.
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x18;
    if (uVar7 != uVar12) {
      pcVar8 = "expect %d norms, but got %d\n";
      goto LAB_0014260c;
    }
    uVar7 = ((long)net.shapes.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)net.shapes.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x18;
    if (uVar7 != uVar12) {
      pcVar8 = "expect %d shapes, but got %d\n";
      goto LAB_0014260c;
    }
    uVar7 = (long)net.type_to_pixels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)net.type_to_pixels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    if (uVar7 != uVar12) {
      pcVar8 = "expect %d pixels, but got %d\n";
      goto LAB_00142611;
    }
    if (-1 < net.quantize_num_threads) {
      fwrite("mean = ",7,1,_stderr);
      print_float_array_list(&net.means);
      fputc(10,_stderr);
      fwrite("norm = ",7,1,_stderr);
      print_float_array_list(&net.norms);
      fputc(10,_stderr);
      fwrite("shape = ",8,1,_stderr);
      for (uVar7 = 0;
          uVar7 < (ulong)(((long)net.shapes.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)net.shapes.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x18);
          uVar7 = uVar7 + 1) {
        pvVar9 = net.shapes.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar7;
        fputc(0x5b,_stderr);
        for (uVar12 = 0;
            piVar2 = (pvVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start,
            uVar12 < (ulong)((long)(pvVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar2 >> 2);
            uVar12 = uVar12 + 1) {
          fprintf(_stderr,"%d",(ulong)(uint)piVar2[uVar12]);
          if (uVar12 != ((long)(pvVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)(pvVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start >> 2) - 1U) {
            fputc(0x2c,_stderr);
          }
        }
        fputc(0x5d,_stderr);
        if (uVar7 != ((long)net.shapes.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)net.shapes.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18 - 1U) {
          fputc(0x2c,_stderr);
        }
      }
      fputc(10,_stderr);
      fwrite("pixel = ",8,1,_stderr);
      sVar3 = 3;
      sVar4 = 4;
      for (uVar7 = 0;
          uVar7 < (ulong)((long)net.type_to_pixels.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)net.type_to_pixels.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 2); uVar7 = uVar7 + 1) {
        sVar11 = sVar3;
        switch(net.type_to_pixels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7]) {
        case 1:
          pcVar8 = "RGB";
          break;
        case 2:
          pcVar8 = "BGR";
          break;
        case 3:
          pcVar8 = "GRAY";
          sVar11 = sVar4;
          break;
        case 4:
          pcVar8 = "RGBA";
          sVar11 = sVar4;
          break;
        case 5:
          pcVar8 = "BGRA";
          sVar11 = sVar4;
          break;
        default:
          if (net.type_to_pixels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7] == -0xe9) {
            pcVar8 = "RAW";
            break;
          }
          goto LAB_0014288e;
        }
        fwrite(pcVar8,sVar11,1,_stderr);
LAB_0014288e:
        if (uVar7 != ((long)net.type_to_pixels.super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_finish -
                      (long)net.type_to_pixels.super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_start >> 2) - 1U) {
          fputc(0x2c,_stderr);
        }
      }
      fputc(10,_stderr);
      fprintf(_stderr,"thread = %d\n",(ulong)(uint)net.quantize_num_threads);
      fprintf(_stderr,"method = %s\n",method._M_dataplus._M_p);
      fwrite("---------------------------------------\n",0x28,1,_stderr);
      bVar5 = std::operator==(&method,"kl");
      if (bVar5) {
        QuantNet::quantize_KL(&net);
      }
      else {
        bVar5 = std::operator==(&method,"aciq");
        if (bVar5) {
          QuantNet::quantize_ACIQ(&net);
        }
        else {
          bVar5 = std::operator==(&method,"eq");
          if (!bVar5) {
            fwrite("not implemented yet !\n",0x16,1,_stderr);
            fprintf(_stderr,"unknown method %s, expect kl / aciq / eq\n",method._M_dataplus._M_p);
            goto LAB_00142618;
          }
          QuantNet::quantize_EQ(&net);
        }
      }
      QuantNet::print_quant_info(&net);
      QuantNet::save_table(&net,local_730);
      iVar6 = 0;
      goto LAB_0014261b;
    }
    fprintf(_stderr,"malformed thread %d\n");
  }
  else {
    pcVar8 = "expect %d lists, but got %d\n";
LAB_0014260c:
    uVar7 = uVar7 & 0xffffffff;
LAB_00142611:
    fprintf(_stderr,pcVar8,uVar12 & 0xffffffff,uVar7);
  }
LAB_00142618:
  iVar6 = -1;
LAB_0014261b:
  std::__cxx11::string::~string((string *)&method);
  QuantNet::~QuantNet(&net);
  return iVar6;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc < 5)
    {
        show_usage();
        return -1;
    }

    for (int i = 1; i < argc; i++)
    {
        if (argv[i][0] == '-')
        {
            show_usage();
            return -1;
        }
    }

    const char* inparam = argv[1];
    const char* inbin = argv[2];
    char* lists = argv[3];
    const char* outtable = argv[4];

    ncnn::Option opt;
    opt.num_threads = 1;
    opt.use_fp16_packed = false;
    opt.use_fp16_storage = false;
    opt.use_fp16_arithmetic = false;

    QuantNet net;
    net.opt = opt;
    net.load_param(inparam);
    net.load_model(inbin);

    net.init();

    // load lists
    net.listspaths = parse_comma_path_list(lists);

    std::string method = "kl";

    for (int i = 5; i < argc; i++)
    {
        // key=value
        char* kv = argv[i];

        char* eqs = strchr(kv, '=');
        if (eqs == NULL)
        {
            fprintf(stderr, "unrecognized arg %s\n", kv);
            continue;
        }

        // split k v
        eqs[0] = '\0';
        const char* key = kv;
        char* value = eqs + 1;

        // load mean norm shape
        if (memcmp(key, "mean", 4) == 0)
            net.means = parse_comma_float_array_list(value);
        if (memcmp(key, "norm", 4) == 0)
            net.norms = parse_comma_float_array_list(value);
        if (memcmp(key, "shape", 5) == 0)
            net.shapes = parse_comma_int_array_list(value);
        if (memcmp(key, "pixel", 5) == 0)
            net.type_to_pixels = parse_comma_pixel_type_list(value);
        if (memcmp(key, "thread", 6) == 0)
            net.quantize_num_threads = atoi(value);
        if (memcmp(key, "method", 6) == 0)
            method = std::string(value);
    }

    // sanity check
    const size_t input_blob_count = net.input_blobs.size();
    if (net.listspaths.size() != input_blob_count)
    {
        fprintf(stderr, "expect %d lists, but got %d\n", (int)input_blob_count, (int)net.listspaths.size());
        return -1;
    }
    if (net.means.size() != input_blob_count)
    {
        fprintf(stderr, "expect %d means, but got %d\n", (int)input_blob_count, (int)net.means.size());
        return -1;
    }
    if (net.norms.size() != input_blob_count)
    {
        fprintf(stderr, "expect %d norms, but got %d\n", (int)input_blob_count, (int)net.norms.size());
        return -1;
    }
    if (net.shapes.size() != input_blob_count)
    {
        fprintf(stderr, "expect %d shapes, but got %d\n", (int)input_blob_count, (int)net.shapes.size());
        return -1;
    }
    if (net.type_to_pixels.size() != input_blob_count)
    {
        fprintf(stderr, "expect %d pixels, but got %d\n", (int)input_blob_count, (int)net.type_to_pixels.size());
        return -1;
    }
    if (net.quantize_num_threads < 0)
    {
        fprintf(stderr, "malformed thread %d\n", net.quantize_num_threads);
        return -1;
    }

    // print quantnet config
    {
        fprintf(stderr, "mean = ");
        print_float_array_list(net.means);
        fprintf(stderr, "\n");
        fprintf(stderr, "norm = ");
        print_float_array_list(net.norms);
        fprintf(stderr, "\n");
        fprintf(stderr, "shape = ");
        print_int_array_list(net.shapes);
        fprintf(stderr, "\n");
        fprintf(stderr, "pixel = ");
        print_pixel_type_list(net.type_to_pixels);
        fprintf(stderr, "\n");
        fprintf(stderr, "thread = %d\n", net.quantize_num_threads);
        fprintf(stderr, "method = %s\n", method.c_str());
        fprintf(stderr, "---------------------------------------\n");
    }

    if (method == "kl")
    {
        net.quantize_KL();
    }
    else if (method == "aciq")
    {
        net.quantize_ACIQ();
    }
    else if (method == "eq")
    {
        net.quantize_EQ();
    }
    else
    {
        fprintf(stderr, "not implemented yet !\n");
        fprintf(stderr, "unknown method %s, expect kl / aciq / eq\n", method.c_str());
        return -1;
    }

    net.print_quant_info();

    net.save_table(outtable);

    return 0;
}